

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O0

void __thiscall cmDebugServerJson::OnChangeState(cmDebugServerJson *this)

{
  string local_30;
  cmDebugServerJson *local_10;
  cmDebugServerJson *this_local;
  
  local_10 = this;
  StatusString_abi_cxx11_(&local_30,this);
  cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmDebugServerJson::OnChangeState()
{
  AsyncBroadcast(StatusString());
}